

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeWriteCase::iterate(DepthRangeWriteCase *this)

{
  float *value;
  ostringstream *this_00;
  RenderContext *pRVar1;
  Vec4 *pVVar2;
  bool bVar3;
  deUint32 seed;
  int iVar4;
  GLuint index;
  GLenum GVar5;
  uint uVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  NotSupportedError *this_01;
  TestError *this_02;
  char *description;
  int stepNdx;
  int iVar9;
  int x;
  int height;
  float fVar10;
  allocator<char> local_326;
  allocator<char> local_325;
  int local_324;
  GLint local_320;
  int local_31c;
  TestLog *local_318;
  float *local_310;
  Surface referenceFrame;
  Vec4 color;
  Surface renderedFrame;
  string local_2b8;
  undefined1 local_298 [12];
  int local_28c [3];
  float local_280;
  undefined8 local_27c;
  undefined4 local_274;
  float local_270;
  undefined8 local_26c;
  undefined4 local_264;
  float local_260;
  undefined4 local_25c;
  Random rnd;
  ShaderProgram program;
  int *piVar7;
  
  local_318 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar7 = (int *)CONCAT44(extraout_var,iVar4);
  iVar4 = *piVar7;
  iVar9 = 0x80;
  if (iVar4 < 0x80) {
    iVar9 = iVar4;
  }
  height = 0x80;
  if (piVar7[1] < 0x80) {
    height = piVar7[1];
  }
  local_324 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar4 - iVar9);
  iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar7[1] - height);
  tcu::Surface::Surface(&renderedFrame,iVar9,height);
  tcu::Surface::Surface(&referenceFrame,iVar9,height);
  if (piVar7[6] != 0) {
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&color,
               "attribute highp vec4 a_position;\nattribute highp vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
               ,&local_325);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,
               "uniform mediump vec4 u_color;\nvoid main (void)\n{\n\tgl_FragColor = u_color;\n}\n",
               &local_326);
    glu::makeVtxFragSources((ProgramSources *)local_298,(string *)&color,&local_2b8);
    glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)local_298);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&color);
    if (program.m_program.m_info.linkOk != false) {
      local_320 = glwGetUniformLocation(program.m_program.m_program,"u_color");
      index = glwGetAttribLocation(program.m_program.m_program,"a_position");
      local_298._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_298 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"glDepthRangef(");
      local_310 = &this->m_zNear;
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_298,local_310);
      std::operator<<((ostream *)&pMVar8->m_str,", ");
      value = &this->m_zFar;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
      std::operator<<((ostream *)&pMVar8->m_str,")");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      glwViewport(local_324,iVar4,iVar9,height);
      glwClear(0x4500);
      glwEnable(0xb71);
      glwUseProgram(program.m_program.m_program);
      glwEnableVertexAttribArray(index);
      local_298._0_4_ = 0xbf800000;
      local_298._4_4_ = 0xbf800000;
      pVVar2 = this->m_depthCoord;
      local_298._8_4_ = pVVar2->m_data[0];
      local_28c[0] = 0x3f800000;
      local_28c[1] = -0x40800000;
      local_28c[2] = 0x3f800000;
      local_280 = pVVar2->m_data[1];
      local_27c = 0x3f8000003f800000;
      local_274 = 0xbf800000;
      local_270 = pVVar2->m_data[2];
      local_26c = 0x3f8000003f800000;
      local_264 = 0x3f800000;
      local_260 = pVVar2->m_data[3];
      local_25c = 0x3f800000;
      glwDepthFunc(0x207);
      glwDepthRangef(*local_310,*value);
      glwUniform4f(local_320,0.0,1.0,0.0,1.0);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
      glwDrawElements(4,6,0x1403,iterate::quadIndices);
      GVar5 = glwGetError();
      glu::checkError(GVar5,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                      ,0x156);
      glwDepthFunc(0x203);
      glwDepthMask('\0');
      glwDepthRangef(0.0,1.0);
      local_31c = iVar4;
      for (iVar9 = 0; iVar9 != 0x20; iVar9 = iVar9 + 1) {
        color.m_data[0] = (float)iVar9 * 0.032258064;
        local_298._8_4_ = color.m_data[0] + color.m_data[0] + -1.0;
        color.m_data[3] = 1.0;
        local_298._0_4_ = 0xbf800000;
        local_298._4_4_ = 0xbf800000;
        local_28c[0] = 0x3f800000;
        local_28c[1] = -0x40800000;
        local_28c[2] = 0x3f800000;
        local_27c = 0x3f8000003f800000;
        local_274 = 0xbf800000;
        local_26c = 0x3f8000003f800000;
        local_264 = 0x3f800000;
        local_25c = 0x3f800000;
        color.m_data[1] = color.m_data[0];
        color.m_data[2] = color.m_data[0];
        local_280 = (float)local_298._8_4_;
        local_270 = (float)local_298._8_4_;
        local_260 = (float)local_298._8_4_;
        glwUniform4fv(local_320,1,color.m_data);
        glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
        glwDrawElements(4,6,0x1403,iterate::quadIndices);
      }
      GVar5 = glwGetError();
      iVar9 = local_31c;
      iVar4 = local_324;
      glu::checkError(GVar5,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                      ,0x172);
      pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_298,&renderedFrame);
      glu::readPixels(pRVar1,iVar4,iVar9,(PixelBufferAccess *)local_298);
      for (iVar4 = 0; iVar4 < referenceFrame.m_height; iVar4 = iVar4 + 1) {
        for (iVar9 = 0; iVar9 < referenceFrame.m_width; iVar9 = iVar9 + 1) {
          fVar10 = triQuadInterpolate(((float)iVar9 + 0.5) / (float)referenceFrame.m_width,
                                      ((float)iVar4 + 0.5) / (float)referenceFrame.m_height,
                                      this->m_depthCoord);
          fVar10 = depthRangeTransform(fVar10,*local_310,*value);
          fVar10 = floorf(fVar10 / 0.032258064);
          fVar10 = (float)(int)fVar10 * 0.032258064 * 255.0;
          uVar6 = (uint)(fVar10 + *(float *)(&DAT_005c33b8 + (ulong)(fVar10 < 0.0) * 4));
          if (0xfe < (int)uVar6) {
            uVar6 = 0xff;
          }
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          *(uint *)((long)referenceFrame.m_pixels.m_ptr +
                   (long)(referenceFrame.m_width * iVar4 + iVar9) * 4) =
               uVar6 << 0x10 | uVar6 << 8 | uVar6 | 0xff000000;
        }
      }
      bVar3 = tcu::fuzzyCompare(local_318,"Result","Image comparison result",&referenceFrame,
                                &renderedFrame,0.05,COMPARE_LOG_RESULT);
      description = "Fail";
      if (bVar3) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar3,
                 description);
      glu::ShaderProgram::~ShaderProgram(&program);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      return STOP;
    }
    glu::operator<<(local_318,&program);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x137);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Depth buffer is required","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
             ,0x130);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

DepthRangeWriteCase::IterateResult DepthRangeWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	const int					viewportW		= de::min(128, renderTarget.getWidth());
	const int					viewportH		= de::min(128, renderTarget.getHeight());
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= VISUALIZE_DEPTH_STEPS;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc		= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc			= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with depth range.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthFunc(GL_ALWAYS);
		glDepthRangef(m_zNear, m_zFar);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		GLU_CHECK();
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glDepthFunc(GL_LEQUAL);
		glDepthMask(GL_FALSE);
		glDepthRangef(0.0f, 1.0f);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};

			glUniform4fv(colorLoc, 1, color.getPtr());
			glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
			glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		}

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}